

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int fast_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  bool bVar1;
  double dVar2;
  double local_80;
  double fnow;
  double enow;
  uint local_68;
  int hindex;
  int findex;
  int eindex;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double Qnew;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  dVar2 = *e;
  Qnew = *f;
  bVar1 = dVar2 < Qnew != -dVar2 < Qnew;
  if (bVar1) {
    local_80 = f[1];
    fnow = dVar2;
  }
  else {
    local_80 = Qnew;
    fnow = e[1];
    Qnew = dVar2;
  }
  hindex = (int)!bVar1;
  local_68 = (uint)bVar1;
  enow._4_4_ = 0;
  if ((hindex < elen) && ((int)local_68 < flen)) {
    if (fnow < local_80 == -fnow < local_80) {
      bvirt = fnow + Qnew;
      *h = Qnew - (bvirt - fnow);
      hindex = hindex + 1;
      fnow = e[hindex];
    }
    else {
      bvirt = local_80 + Qnew;
      *h = Qnew - (bvirt - local_80);
      local_68 = local_68 + 1;
      local_80 = f[(int)local_68];
    }
    Qnew = bvirt;
    enow._4_4_ = 1;
    while (hindex < elen && (int)local_68 < flen) {
      if (fnow < local_80 == -fnow < local_80) {
        bvirt = Qnew + fnow;
        h[enow._4_4_] = (Qnew - (bvirt - (bvirt - Qnew))) + (fnow - (bvirt - Qnew));
        hindex = hindex + 1;
        fnow = e[hindex];
      }
      else {
        bvirt = Qnew + local_80;
        h[enow._4_4_] = (Qnew - (bvirt - (bvirt - Qnew))) + (local_80 - (bvirt - Qnew));
        local_68 = local_68 + 1;
        local_80 = f[(int)local_68];
      }
      Qnew = bvirt;
      enow._4_4_ = enow._4_4_ + 1;
    }
  }
  while (hindex < elen) {
    dVar2 = Qnew + fnow;
    h[enow._4_4_] = (Qnew - (dVar2 - (dVar2 - Qnew))) + (fnow - (dVar2 - Qnew));
    hindex = hindex + 1;
    fnow = e[hindex];
    enow._4_4_ = enow._4_4_ + 1;
    Qnew = dVar2;
  }
  while ((int)local_68 < flen) {
    dVar2 = Qnew + local_80;
    h[enow._4_4_] = (Qnew - (dVar2 - (dVar2 - Qnew))) + (local_80 - (dVar2 - Qnew));
    local_68 = local_68 + 1;
    local_80 = f[(int)local_68];
    enow._4_4_ = enow._4_4_ + 1;
    Qnew = dVar2;
  }
  h[enow._4_4_] = Qnew;
  return enow._4_4_ + 1;
}

Assistant:

int fast_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, h[0]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, h[0]);
      fnow = f[++findex];
    }
    Q = Qnew;
    hindex = 1;
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, h[hindex]);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, h[hindex]);
        fnow = f[++findex];
      }
      Q = Qnew;
      hindex++;
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, h[hindex]);
    enow = e[++eindex];
    Q = Qnew;
    hindex++;
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, h[hindex]);
    fnow = f[++findex];
    Q = Qnew;
    hindex++;
  }
  h[hindex] = Q;
  return hindex + 1;
}